

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plain_server.cpp
# Opt level: O0

void __thiscall zmq::plain_server_t::produce_error(plain_server_t *this,msg_t *msg_)

{
  int iVar1;
  long lVar2;
  undefined4 *puVar3;
  void *__src;
  size_t __n;
  msg_t *in_RDI;
  char *msg_data;
  int rc;
  size_t status_code_len_size;
  char expected_status_code_len;
  size_t in_stack_ffffffffffffffc0;
  
  lVar2 = std::__cxx11::string::length();
  if (lVar2 != 3) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
            "status_code.length () == static_cast<size_t> (expected_status_code_len)",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/plain_server.cpp"
            ,0xe6);
    fflush(_stderr);
    zmq_abort((char *)0x318171);
  }
  iVar1 = msg_t::init_size(in_RDI,in_stack_ffffffffffffffc0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 0",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/plain_server.cpp"
            ,0xea);
    fflush(_stderr);
    zmq_abort((char *)0x3181e6);
  }
  puVar3 = (undefined4 *)msg_t::data(in_RDI);
  *puVar3 = 0x4f52525e;
  *(undefined1 *)(puVar3 + 1) = 0x52;
  *(undefined1 *)((long)puVar3 + 5) = 3;
  __src = (void *)std::__cxx11::string::c_str();
  __n = std::__cxx11::string::length();
  memcpy((void *)((long)puVar3 + 6),__src,__n);
  return;
}

Assistant:

void zmq::plain_server_t::produce_error (msg_t *msg_) const
{
    const char expected_status_code_len = 3;
    zmq_assert (status_code.length ()
                == static_cast<size_t> (expected_status_code_len));
    const size_t status_code_len_size = sizeof (expected_status_code_len);
    const int rc = msg_->init_size (error_prefix_len + status_code_len_size
                                    + expected_status_code_len);
    zmq_assert (rc == 0);
    char *msg_data = static_cast<char *> (msg_->data ());
    memcpy (msg_data, error_prefix, error_prefix_len);
    msg_data[error_prefix_len] = expected_status_code_len;
    memcpy (msg_data + error_prefix_len + status_code_len_size,
            status_code.c_str (), status_code.length ());
}